

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

void __thiscall
MyServer::OnAdvertisement
          (MyServer *this,string *ipString,uint16_t port,uint8_t *data,uint32_t bytes)

{
  OutputWorker *pOVar1;
  uint8_t pong [1];
  undefined7 uStack_1a7;
  ostringstream local_198 [376];
  
  if (bytes == 1) {
    if (*data == 200) {
      if ((int)Logger.ChannelMinLevel < 3) {
        _pong = Logger.ChannelName;
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::operator<<((ostream *)local_198,(string *)&Logger.Prefix);
        std::operator<<((ostream *)local_198,"Advertisement PONG received from ");
        std::operator<<((ostream *)local_198,(string *)ipString);
        std::operator<<((ostream *)local_198,":");
        std::ostream::operator<<((ostream *)local_198,port);
        std::operator<<((ostream *)local_198," - ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_198);
        std::operator<<((ostream *)local_198," bytes");
        pOVar1 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)pong);
        std::__cxx11::ostringstream::~ostringstream(local_198);
      }
    }
    else if (*data == 'd') {
      if ((int)Logger.ChannelMinLevel < 3) {
        _pong = Logger.ChannelName;
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::operator<<((ostream *)local_198,(string *)&Logger.Prefix);
        std::operator<<((ostream *)local_198,"Advertisement PING received from ");
        std::operator<<((ostream *)local_198,(string *)ipString);
        std::operator<<((ostream *)local_198,":");
        std::ostream::operator<<((ostream *)local_198,port);
        std::operator<<((ostream *)local_198," - ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_198);
        std::operator<<((ostream *)local_198," bytes");
        pOVar1 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)pong);
        std::__cxx11::ostringstream::~ostringstream(local_198);
      }
      _pong = (char *)CONCAT71(uStack_1a7,200);
      tonk::SDKSocket::Advertise(&this->super_SDKSocket,ipString,port,pong,1);
    }
  }
  return;
}

Assistant:

void MyServer::OnAdvertisement(
    const std::string& ipString, ///< Source IP address of advertisement
    uint16_t               port, ///< Source port address of advertisement
    const uint8_t*         data,  ///< Pointer to a buffer containing the message data
    uint32_t              bytes)  ///< Number of bytes in the message
{
    if (bytes != 1) {
        return;
    }

    if (data[0] == 100)
    {
        Logger.Info("Advertisement PING received from ", ipString, ":", port, " - ", bytes, " bytes");

        uint8_t pong[1] = {
            200
        };
        Advertise(ipString, port, pong, 1);
        return;
    }

    if (data[0] == 200)
    {
        Logger.Info("Advertisement PONG received from ", ipString, ":", port, " - ", bytes, " bytes");
        return;
    }
}